

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coherent_memory_write.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  bool local_d1;
  int local_d0;
  int local_cc;
  int k;
  int j;
  int i;
  GLenum mapping_flags [2];
  int mapping_flags_count;
  int quads_offsets [3] [2];
  int quads_offstes_count;
  size_t mapping_offsets [9];
  int mapping_offsets_count;
  int height;
  int width;
  bool pass;
  size_t ssbo_alignment;
  size_t page_size;
  GLFWwindow *pGStack_20;
  GLint alignment;
  GLFWwindow *window;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  window = (GLFWwindow *)argv;
  argv_local._0_4_ = argc;
  glfwInit();
  glfwWindowHint(0x20004,1);
  glfwWindowHint(0x22002,4);
  glfwWindowHint(0x22003,3);
  glfwWindowHint(0x22006,1);
  glfwWindowHint(0x22008,0x32001);
  pGStack_20 = glfwCreateWindow(0x400,0x400,"Coherent memory write",(GLFWmonitor *)0x0,
                                (GLFWwindow *)0x0);
  if (pGStack_20 == (GLFWwindow *)0x0) {
    argv_local._4_4_ = 0x7d;
  }
  else {
    glfwMakeContextCurrent(pGStack_20);
    iVar2 = gladLoadGLLoader(glfwGetProcAddress);
    if (iVar2 == 0) {
      argv_local._4_4_ = 1;
    }
    else {
      (*glad_glGetIntegerv)(0x90df,(GLint *)((long)&page_size + 4));
      mapping_offsets[2] = getSystemPageSize();
      mapping_offsets[0] = (size_t)page_size._4_4_;
      height._3_1_ = true;
      mapping_offsets[1] = mapping_offsets[2] >> 1;
      mapping_offsets[3] = mapping_offsets[2] + mapping_offsets[0];
      mapping_offsets[4] = mapping_offsets[2] - mapping_offsets[0];
      mapping_offsets[5] = mapping_offsets[2] << 1;
      mapping_offsets[6] = mapping_offsets[2] * 10;
      mapping_offsets[7] = mapping_offsets[2] * 4 + mapping_offsets[0] * 2;
      quads_offsets[2][1] = 3;
      stack0xffffffffffffff48 = 0x4000000040;
      quads_offsets[0][0] = 0x80;
      quads_offsets[0][1] = 0x80;
      quads_offsets[1][0] = 0;
      quads_offsets[1][1] = 0;
      mapping_flags[0] = 2;
      _j = 0xc3000000c2;
      build_programm();
      for (k = 0; k < 2; k = k + 1) {
        for (local_cc = 0; local_cc < 9; local_cc = local_cc + 1) {
          height._3_1_ = setup_buffers(0x100,0x100,mapping_offsets[(long)local_cc + -1],(&j)[k]);
          if (!height._3_1_) {
            return 1;
          }
          for (local_d0 = 0; local_d0 < 3; local_d0 = local_d0 + 1) {
            draw(pGStack_20,0x100,0x100,mapping_offsets[(long)local_cc + -1],
                 mapping_flags[(long)local_d0 * 2 + 1],quads_offsets[(long)local_d0 + -1][1],(&j)[k]
                );
            bVar1 = probe(0x100,0x100);
            local_d1 = false;
            if (bVar1) {
              local_d1 = height._3_1_;
            }
            height._3_1_ = local_d1;
          }
          unmap_buffers(0x100,0x100,mapping_offsets[(long)local_cc + -1]);
        }
      }
      glfwDestroyWindow(pGStack_20);
      glfwTerminate();
      if (height._3_1_ == false) {
        printf("Probe failed \n");
      }
      else {
        printf("Passed successfully \n");
      }
      argv_local._4_4_ = (uint)(height._3_1_ == false);
    }
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char** argv) {
    glfwInit();

    glfwWindowHint(GLFW_VISIBLE, GLFW_TRUE);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 3);
    glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);

    GLFWwindow* window = glfwCreateWindow(1024, 1024, "Coherent memory write", NULL, NULL);

    if (!window) {
        return EXIT_SKIP;
    }

    glfwMakeContextCurrent(window);

    if (!gladLoadGLLoader((GLADloadproc)glfwGetProcAddress)) {
        return EXIT_FAILURE;
    }

    GLint alignment;
    glGetIntegerv(GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT, &alignment);
    const size_t page_size = getSystemPageSize();
    const size_t ssbo_alignment = static_cast<const size_t>(alignment);

    bool pass = true;
    const int width = 256;
    const int height = 256;

    const int mapping_offsets_count = 9;
    const size_t mapping_offsets[mapping_offsets_count] = {
        0,
        ssbo_alignment,
        page_size / 2,
        page_size,
        page_size + ssbo_alignment,
        page_size - ssbo_alignment,
        page_size * 2,
        page_size * 10,
        page_size * 4 + 2 * ssbo_alignment
    };

    const int quads_offstes_count = 3;
    const int quads_offsets[quads_offstes_count][2] = {
        { width / 4, height / 4 },
        { width / 2, height / 2 },
        { 0, 0 }
    };

    const int mapping_flags_count = 2;
    const GLenum mapping_flags[mapping_flags_count] = {
        GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT,
        GL_MAP_WRITE_BIT | GL_MAP_READ_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT
    };

    build_programm();

    for (int i = 0; i < mapping_flags_count; i++) {
        for (int j = 0; j < mapping_offsets_count; j++) {
            pass = setup_buffers(width, height, mapping_offsets[j], mapping_flags[i]);

            if (!pass) {
                return EXIT_FAILURE;
            }

            for (int k = 0; k < quads_offstes_count; k++) {
                draw(window, width, height, mapping_offsets[j],
                    quads_offsets[k][0], quads_offsets[k][1],
                    mapping_flags[i]);

                pass = probe(width, height) && pass;
            }
            unmap_buffers(width, height, mapping_offsets[j]);
        }
    }

    glfwDestroyWindow(window);
    glfwTerminate();

    if (pass) {
        printf("Passed successfully \n");
    } else {
        printf("Probe failed \n");
    }

    return pass ? 0 : EXIT_FAILURE;
}